

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

array<unsigned_int,_3UL> __thiscall
polyscope::render::ManagedBuffer<float>::getTextureSize(ManagedBuffer<float> *this)

{
  array<unsigned_int,_3UL> aVar1;
  allocator local_31;
  string local_30;
  
  if (this->deviceBufferType == Attribute) {
    std::__cxx11::string::string((string *)&local_30,"managed buffer is not a texture",&local_31);
    exception(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  aVar1._M_elems[0] = this->sizeX;
  aVar1._M_elems[1] = this->sizeY;
  aVar1._M_elems[2] = this->sizeZ;
  return (array<unsigned_int,_3UL>)aVar1._M_elems;
}

Assistant:

std::array<uint32_t, 3> ManagedBuffer<T>::getTextureSize() const {
  if (deviceBufferType == DeviceBufferType::Attribute) exception("managed buffer is not a texture");
  return std::array<uint32_t, 3>{sizeX, sizeY, sizeZ};
}